

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_>::
~TypedAttributeWithFallback
          (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *this)

{
  pointer pSVar1;
  void *pvVar2;
  
  pSVar1 = (this->_fallback)._ts._samples.
           super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar1 != (pointer)0x0) {
    operator_delete(pSVar1,(long)(this->_fallback)._ts._samples.
                                 super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar1);
  }
  if (((this->_attrib).has_value_ == true) &&
     (pvVar2 = *(void **)((long)&(this->_attrib).contained + 8), pvVar2 != (void *)0x0)) {
    operator_delete(pvVar2,*(long *)((long)&(this->_attrib).contained + 0x18) - (long)pvVar2);
  }
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&this->_paths);
  AttrMetas::~AttrMetas(&this->_metas);
  return;
}

Assistant:

static std::string type_name() { return value::TypeTraits<T>::type_name(); }